

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O2

void __thiscall Minisat::vec<double,_int>::clear(vec<double,_int> *this,bool dealloc)

{
  if ((this->data != (double *)0x0) && (this->sz = 0, dealloc)) {
    free(this->data);
    this->data = (double *)0x0;
    this->cap = 0;
  }
  return;
}

Assistant:

void vec<T,_Size>::clear(bool dealloc) {
    if (data != NULL){
        for (Size i = 0; i < sz; i++) data[i].~T();
        sz = 0;
        if (dealloc) free(data), data = NULL, cap = 0; } }